

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_GetSetRGB_Test::TestBody(Image_GetSetRGB_Test *this)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Allocator alloc;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  long lVar4;
  char *pcVar5;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar6
  ;
  ColorEncodingHandle *encoding;
  int x;
  ulong uVar7;
  Point2i p;
  int c;
  int c_00;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  AssertionResult gtest_ar__1;
  AssertHelper local_2b8;
  Float local_2b0 [2];
  long local_2a8;
  PixelFormat local_2a0;
  Float qv;
  ulong local_298;
  ImageChannelValues rgb;
  string local_250 [32];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  size_t *local_200;
  size_t *local_1f8;
  size_t *local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  ulong local_1d0;
  WrapMode2D local_1c8;
  WrapMode2D local_1c0;
  WrapMode2D local_1b8;
  ColorEncodingHandle local_1b0;
  PixelFormat local_1a4 [3];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageChannelDesc rgbDesc;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x2000000007,3);
  local_1a4[0] = U256;
  local_1a4[1] = Half;
  local_1f0 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc;
  local_1a4[2] = 2;
  local_1f8 = local_1f0;
  local_200 = local_1f0;
  lVar4 = 0;
  do {
    if (lVar4 == 0xc) {
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
      return;
    }
    local_1e0 = lVar4;
    local_2a0 = *(PixelFormat *)((long)local_1a4 + lVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rgb,"R",(allocator<char> *)&rgbDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
               "G",(allocator<char> *)&gtest_ar_);
    std::__cxx11::string::string<std::allocator<char>>
              (local_250,"B",(allocator<char> *)&gtest_ar__1);
    local_1b0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_1b0;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb;
    pbrt::Image::Image(&image,local_2a0,(Point2i)0x2000000007,channels,encoding,alloc);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                         .alloc.memoryResource + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    uVar9 = 0;
    lVar4 = 0;
    while( true ) {
      if (lVar4 == 0x20) break;
      local_2a8 = lVar4;
      local_298 = uVar9;
      for (uVar7 = 0; uVar7 != 7; uVar7 = uVar7 + 1) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          pbrt::Image::SetChannel
                    (&image,(Point2i)(lVar4 << 0x20 | uVar7),(int)lVar8,
                     *(Float *)((long)rgbPixels.ptr + lVar8 * 4 + uVar9));
        }
        uVar9 = uVar9 + 0xc;
      }
      lVar4 = local_2a8 + 1;
      uVar9 = local_298 + 0x54;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rgb,"R",(allocator<char> *)&gtest_ar_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
               "G",(allocator<char> *)&gtest_ar__1);
    std::__cxx11::string::string<std::allocator<char>>(local_250,"B",(allocator<char> *)local_2b0);
    requestedChannels.n = 3;
    requestedChannels.ptr = (string *)&rgb;
    pbrt::Image::GetChannelDesc(&rgbDesc,&image,requestedChannels);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                         .alloc.memoryResource + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = rgbDesc.offset.nStored != 0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rgb,(internal *)&gtest_ar_,(AssertionResult *)"bool(rgbDesc)","false",
                 "true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x98,(char *)rgb.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
      std::__cxx11::string::~string((string *)&rgb);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rgb,"R",(allocator<char> *)local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nAlloc,
               "Gxxx",(allocator<char> *)&local_2b8);
    std::__cxx11::string::string<std::allocator<char>>(local_250,"B",(allocator<char> *)&qv);
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr = (string *)&rgb;
    pbrt::Image::GetChannelDesc((ImageChannelDesc *)&gtest_ar_,&image,requestedChannels_00);
    gtest_ar__1.success_ = local_220.field_2._8_8_ == 0;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&gtest_ar_);
    lVar4 = 0x40;
    do {
      std::__cxx11::string::~string
                ((string *)
                 ((long)&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                         .alloc.memoryResource + lVar4));
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x20);
    if (gtest_ar__1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&rgb,(internal *)&gtest_ar__1,
                 (AssertionResult *)"bool(image.GetChannelDesc({\"R\", \"Gxxx\", \"B\"}))","true",
                 "false",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x99,(char *)rgb.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_2b0,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
      std::__cxx11::string::~string((string *)&rgb);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    local_1e8 = 0;
    lVar4 = 0;
    while (lVar4 != 0x20) {
      local_1d0 = lVar4 << 0x20;
      local_2a8 = local_1e8;
      uVar9 = 0;
      local_1d8 = lVar4;
      while( true ) {
        if (uVar9 == 7) break;
        local_298 = uVar9;
        pbrt::WrapMode2D::WrapMode2D(&local_1b8,Clamp);
        p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_1d0 | local_298);
        pbrt::Image::GetChannels(&rgb,&image,p,local_1b8);
        local_2b0[0] = 4.2039e-45;
        gtest_ar__1._0_8_ =
             rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored;
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)&gtest_ar_,"3","rgb.size()",(int *)local_2b0,
                   (unsigned_long *)&gtest_ar__1);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__1);
          pcVar5 = "";
          if (gtest_ar_.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x9e,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_2b0,(Message *)&gtest_ar__1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        pbrt::WrapMode2D::WrapMode2D(&local_1c0,Clamp);
        pbrt::Image::GetChannels((ImageChannelValues *)&gtest_ar_,&image,p,&rgbDesc,local_1c0);
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        sVar6 = gtest_ar_.message_;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar6.ptr_ = &local_220;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar__1,"rgb[0]","rgb2[0]",paVar3->fixed,(float *)sVar6.ptr_);
        if (gtest_ar__1.success_ == false) {
          testing::Message::Message((Message *)local_2b0);
          pcVar5 = "";
          if (gtest_ar__1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa1,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__1.message_);
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pbVar2 = &local_220;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar__1,"rgb[1]","rgb2[1]",paVar3->fixed + 1,
                   (float *)((long)&(pbVar2->_M_dataplus)._M_p + 4));
        if (gtest_ar__1.success_ == false) {
          testing::Message::Message((Message *)local_2b0);
          pcVar5 = "";
          if (gtest_ar__1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__1.message_);
        paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr;
        if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
            (float *)0x0) {
          paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    field_2;
        }
        sVar6 = gtest_ar_.message_;
        if (gtest_ar_.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          sVar6.ptr_ = &local_220;
        }
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar__1,"rgb[2]","rgb2[2]",paVar3->fixed + 2,
                   (float *)&(sVar6.ptr_)->_M_string_length);
        if (gtest_ar__1.success_ == false) {
          testing::Message::Message((Message *)local_2b0);
          pcVar5 = "";
          if (gtest_ar__1.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0xa3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
          testing::internal::AssertHelper::~AssertHelper(&local_2b8);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_2b0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar__1.message_);
        c_00 = 0;
        for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
          paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                    *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      ptr;
          if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
              (float *)0x0) {
            paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          pbrt::WrapMode2D::WrapMode2D(&local_1c8,Clamp);
          local_2b0[0] = pbrt::Image::GetChannel(&image,p,c_00,local_1c8);
          testing::internal::CmpHelperEQ<float,float>
                    ((internal *)&gtest_ar__1,"rgb[c]","image.GetChannel({x, y}, c)",
                     (float *)((long)paVar3 + lVar4),(float *)local_2b0);
          if (gtest_ar__1.success_ == false) {
            testing::Message::Message((Message *)local_2b0);
            pcVar5 = "";
            if (gtest_ar__1.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                       ,0xa6,pcVar5);
            testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
            testing::internal::AssertHelper::~AssertHelper(&local_2b8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_2b0);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          if (local_2a0 == U256) {
            paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                      *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        ptr;
            if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                (float *)0x0) {
              paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        field_2;
            }
            local_2b8.data_._0_4_ = 0x3b00c24b;
            auVar11 = ZEXT416(*(uint *)((long)rgbPixels.ptr + lVar4 + local_2a8));
            auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11);
            uVar1 = vcmpss_avx512f(auVar11,ZEXT816(0) << 0x40,1);
            auVar11._8_4_ = 0x7fffffff;
            auVar11._0_8_ = 0x7fffffff7fffffff;
            auVar11._12_4_ = 0x7fffffff;
            auVar10 = vandps_avx512vl(ZEXT416((uint)(*(float *)((long)paVar3 + lVar4) -
                                                    (float)((uint)!(bool)((byte)uVar1 & 1) *
                                                           auVar10._0_4_))),auVar11);
            local_2b0[0] = auVar10._0_4_;
            testing::internal::CmpHelperLT<float,float>
                      ((internal *)&gtest_ar__1,"std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1))",
                       "0.501f / 255.f",(float *)local_2b0,(float *)&local_2b8);
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)local_2b0);
              pcVar5 = "";
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xaa,pcVar5);
              testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
              goto LAB_003440fa;
            }
          }
          else {
            qv = modelQuantization(*(Float *)((long)rgbPixels.ptr + lVar4 + local_2a8),local_2a0);
            paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                      *)rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        ptr;
            if (rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
                (float *)0x0) {
              paVar3 = &rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        field_2;
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&gtest_ar__1,"rgb[c]","qv",(float *)((long)paVar3 + lVar4),&qv);
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)local_2b0);
              pcVar5 = "";
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xad,pcVar5);
              testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_2b0);
LAB_003440fa:
              testing::internal::AssertHelper::~AssertHelper(&local_2b8);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2b0);
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar__1.message_);
          c_00 = c_00 + 1;
        }
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&gtest_ar_);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  (&rgb.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
        local_2a8 = local_2a8 + 0xc;
        uVar9 = local_298 + 1;
      }
      local_1e8 = local_1e8 + 0x54;
      lVar4 = local_1d8 + 1;
    }
    pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              (&rgbDesc.offset);
    pbrt::Image::~Image(&image);
    lVar4 = local_1e0 + 4;
  } while( true );
}

Assistant:

TEST(Image, GetSetRGB) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        EXPECT_TRUE(bool(rgbDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"R", "Gxxx", "B"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues rgb2 = image.GetChannels({x, y}, rgbDesc);
                EXPECT_EQ(rgb[0], rgb2[0]);
                EXPECT_EQ(rgb[1], rgb2[1]);
                EXPECT_EQ(rgb[2], rgb2[2]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}